

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::cylinderMesh(Mesh *__return_storage_ptr__,float _radius,float _height,
                         int _radiusSegments,int _heightSegments,int _numCapSegments,bool _bCapped,
                         DrawMode _drawMode)

{
  Mesh *this;
  int iVar1;
  DrawMode DVar2;
  int ix;
  int x;
  int iVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint32_t _i;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  vec<3,_float,_(glm::qualifier)0> vVar15;
  float local_15c;
  float minTexYNormalized;
  float local_154;
  float local_150;
  float local_14c;
  ulong local_148;
  float local_13c;
  Mesh *local_138;
  float local_12c;
  float local_128;
  float _radius_local;
  ulong local_120;
  vec2 tcoord;
  vec3 vert;
  ulong local_f0;
  vec3 local_e8;
  float local_d8;
  undefined4 uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  ulong local_c0;
  undefined8 local_b8;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  ulong local_98;
  ulong local_90;
  float local_88;
  float local_84;
  int local_80;
  float local_7c;
  float local_78;
  undefined4 uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  vec<3,_float,_(glm::qualifier)0> local_58;
  undefined1 local_48 [16];
  
  local_12c = _height;
  _radius_local = _radius;
  Mesh::Mesh(__return_storage_ptr__);
  DVar2 = TRIANGLE_STRIP;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    DVar2 = _drawMode;
  }
  local_98 = (ulong)(uint)_heightSegments;
  if (_heightSegments < 2) {
    local_98 = 1;
  }
  bVar12 = 0 < _numCapSegments;
  local_90 = (ulong)(_numCapSegments + 1);
  if (!bVar12 || !_bCapped) {
    local_90 = 1;
  }
  local_58.field_2.z = 0.0;
  local_120 = (ulong)(_radiusSegments + 1U);
  __return_storage_ptr__->m_drawMode = DVar2;
  fVar14 = (float)(int)(_radiusSegments + 1U) + -1.0;
  uStack_74 = (undefined4)((ulong)(double)fVar14 >> 0x20);
  local_78 = (float)(-6.283185307179586 / (double)fVar14);
  local_80 = (int)local_98 + 1;
  local_84 = (float)local_80;
  local_68 = local_84 + -1.0;
  local_58.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_58.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_88 = (float)((int)local_90 * 2) + -2.0 + local_68;
  local_128 = (float)_numCapSegments;
  local_13c = ((float)(int)local_90 + -1.0) / local_88;
  local_48 = ZEXT416((uint)(local_12c * 0.5));
  local_c0 = (ulong)(uint)_numCapSegments;
  uStack_70 = in_XMM1_Dc;
  uStack_6c = in_XMM1_Dd;
  if (bVar12 && _bCapped) {
    local_e8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_e8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
    local_e8.field_2.z = 0.0;
    local_b8 = CONCAT44(0x80000000,-(local_12c * 0.5));
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_138 = __return_storage_ptr__;
    for (iVar1 = 0; __return_storage_ptr__ = local_138, iVar1 != (int)local_90; iVar1 = iVar1 + 1) {
      local_d8 = (float)iVar1;
      for (iVar3 = 0; iVar3 <= _radiusSegments; iVar3 = iVar3 + 1) {
        minTexYNormalized = local_d8;
        local_15c = 0.0;
        local_14c = local_128;
        local_150 = 0.0;
        fVar13 = remap(&minTexYNormalized,&local_15c,&local_14c,&local_150,&_radius_local,true);
        local_154 = (float)iVar3;
        local_a8 = local_78 * local_154;
        uStack_a4 = uStack_74;
        uStack_a0 = uStack_70;
        uStack_9c = uStack_6c;
        local_148 = CONCAT44(local_148._4_4_,fVar13);
        fVar13 = cosf(local_a8);
        vert.field_0.x = fVar13 * (float)local_148;
        fVar13 = sinf(local_a8);
        vert.field_2.z = fVar13 * (float)local_148;
        vert.field_1 = local_b8._0_4_;
        tcoord.field_0.x = local_154 / fVar14;
        minTexYNormalized = local_d8;
        local_15c = 0.0;
        local_14c = local_128;
        local_150 = 0.0;
        fVar13 = remap(&minTexYNormalized,&local_15c,&local_14c,&local_150,&local_13c,true);
        this = local_138;
        tcoord.field_1.y = 1.0 - fVar13;
        Mesh::addTexCoord(local_138,&tcoord);
        Mesh::addVertex(this,&vert);
        Mesh::addNormal(this,&local_e8);
      }
    }
    if (DVar2 == TRIANGLES) {
      fVar13 = 0.0;
      local_a8 = 0.0;
      if (0 < _radiusSegments) {
        local_a8 = (float)_radiusSegments;
      }
      local_148 = (ulong)(_radiusSegments + 2);
      fVar4 = 0.0;
      while (fVar4 != (float)local_c0) {
        local_154 = (float)((int)fVar4 + 1);
        fVar6 = local_a8;
        local_d8 = fVar13;
        while (bVar11 = fVar6 != 0.0, fVar6 = (float)((int)fVar6 + -1), bVar11) {
          if (fVar4 != 0.0) {
            Mesh::addIndex(__return_storage_ptr__,(uint32_t)fVar13);
            Mesh::addIndex(__return_storage_ptr__,(int)fVar13 + 1);
            Mesh::addIndex(__return_storage_ptr__,(int)local_120 + (int)fVar13);
          }
          Mesh::addIndex(__return_storage_ptr__,(int)fVar13 + 1U);
          Mesh::addIndex(__return_storage_ptr__,(int)local_148 + (int)fVar13);
          Mesh::addIndex(__return_storage_ptr__,(int)fVar13 + (int)local_120);
          fVar13 = (float)((int)fVar13 + 1U);
        }
        fVar13 = (float)((int)local_d8 + (int)local_120);
        fVar4 = local_154;
      }
    }
    else {
      iVar3 = 0;
      iVar1 = 0;
      while (iVar5 = iVar1, (float)iVar3 != (float)local_c0) {
        iVar3 = iVar3 + 1;
        iVar1 = (int)local_120 + iVar5;
        for (iVar7 = 0; iVar7 <= _radiusSegments; iVar7 = iVar7 + 1) {
          Mesh::addIndex(__return_storage_ptr__,iVar5 + iVar7);
          Mesh::addIndex(__return_storage_ptr__,iVar1 + iVar7);
        }
      }
    }
    local_f0 = ((long)(__return_storage_ptr__->m_vertices).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->m_vertices).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    minTexYNormalized = 0.0;
    if (bVar12 && _bCapped) {
      minTexYNormalized = local_13c;
      local_13c = local_84 / local_88;
    }
    else {
      local_13c = 1.0;
    }
  }
  else {
    minTexYNormalized = 0.0;
    local_13c = 1.0;
    local_f0 = 0;
  }
  local_12c = local_12c / local_68;
  local_68 = -(float)local_48._0_4_;
  uStack_64 = local_48._4_4_ ^ 0x80000000;
  uStack_60 = local_48._8_4_ ^ 0x80000000;
  uStack_5c = local_48._12_4_ ^ 0x80000000;
  local_138 = (Mesh *)CONCAT44(local_138._4_4_,(float)(int)local_98);
  uStack_b0 = uStack_70 ^ 0x80000000;
  uStack_ac = uStack_6c ^ 0x80000000;
  local_b8 = CONCAT44(uStack_74,local_78) ^ 0x8000000080000000;
  for (iVar1 = 0; iVar1 != local_80; iVar1 = iVar1 + 1) {
    local_e8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_e8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_e8.field_2.z = 0.0;
    local_154 = (float)iVar1;
    local_a8 = local_12c * local_154 + local_68;
    for (iVar3 = 0; iVar3 <= _radiusSegments; iVar3 = iVar3 + 1) {
      local_148 = CONCAT44(local_148._4_4_,(float)iVar3);
      local_d8 = local_78 * (float)iVar3;
      uStack_d4 = uStack_74;
      uStack_d0 = uStack_70;
      uStack_cc = uStack_6c;
      fVar13 = cosf(local_d8);
      vert.field_0.x = fVar13 * _radius_local;
      vert.field_1.y = local_a8;
      fVar13 = sinf(local_d8);
      vert.field_2.z = fVar13 * _radius_local;
      tcoord.field_0.x = (float)local_148 / fVar14;
      local_15c = local_154;
      local_14c = 0.0;
      local_150 = local_138._0_4_;
      fVar13 = remap(&local_15c,&local_14c,&local_150,&minTexYNormalized,&local_13c,true);
      tcoord.field_1.y = 1.0 - fVar13;
      Mesh::addTexCoord(__return_storage_ptr__,&tcoord);
      Mesh::addVertex(__return_storage_ptr__,&vert);
      Mesh::addNormal(__return_storage_ptr__,&local_e8);
      local_15c = local_b8._0_4_;
      vVar15 = glm::rotate<float,(glm::qualifier)0>(&local_e8,&local_15c,&local_58);
      local_e8.field_2 = vVar15.field_2;
      local_e8._0_8_ = vVar15._0_8_;
    }
  }
  if (DVar2 == TRIANGLES) {
    uVar9 = (int)local_f0 + 1;
    iVar3 = 0;
    iVar1 = 0;
    if (0 < _radiusSegments) {
      iVar1 = _radiusSegments;
    }
    local_148 = CONCAT44(local_148._4_4_,iVar1);
    while (iVar3 != (int)local_98) {
      iVar3 = iVar3 + 1;
      iVar1 = (int)(float)local_148;
      _i = uVar9;
      while (bVar11 = iVar1 != 0, iVar1 = iVar1 + -1, bVar11) {
        Mesh::addIndex(__return_storage_ptr__,_i - 1);
        Mesh::addIndex(__return_storage_ptr__,_i);
        Mesh::addIndex(__return_storage_ptr__,_radiusSegments + _i);
        Mesh::addIndex(__return_storage_ptr__,_i);
        Mesh::addIndex(__return_storage_ptr__,_radiusSegments + _i + 1);
        Mesh::addIndex(__return_storage_ptr__,_radiusSegments + _i);
        _i = _i + 1;
      }
      uVar9 = uVar9 + (int)local_120;
    }
  }
  else {
    iVar3 = _radiusSegments + (int)local_f0 + 1;
    iVar1 = 0;
    while (iVar1 != (int)local_98) {
      iVar1 = iVar1 + 1;
      for (iVar5 = 0; iVar5 <= _radiusSegments; iVar5 = iVar5 + 1) {
        Mesh::addIndex(__return_storage_ptr__,iVar5 + (int)local_f0);
        Mesh::addIndex(__return_storage_ptr__,iVar3 + iVar5);
      }
      iVar3 = iVar3 + (int)local_120;
      local_f0 = (ulong)(uint)((int)local_f0 + (int)local_120);
    }
  }
  if (bVar12 && _bCapped) {
    minTexYNormalized = local_13c;
    local_13c = 1.0;
    local_e8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_e8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
    local_e8.field_2.z = 0.0;
    iVar1 = 0;
    local_b8 = ((long)(__return_storage_ptr__->m_vertices).
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->m_vertices).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    while (iVar1 != (int)local_90) {
      local_138 = (Mesh *)CONCAT44(local_138._4_4_,iVar1);
      local_d8 = (float)iVar1;
      for (iVar1 = 0; iVar1 <= _radiusSegments; iVar1 = iVar1 + 1) {
        local_15c = local_d8;
        local_14c = 0.0;
        local_150 = local_128;
        local_7c = 0.0;
        fVar13 = remap(&local_15c,&local_14c,&local_150,&_radius_local,&local_7c,true);
        local_154 = (float)iVar1;
        local_a8 = local_78 * local_154;
        uStack_a4 = uStack_74;
        uStack_a0 = uStack_70;
        uStack_9c = uStack_6c;
        local_148 = CONCAT44(local_148._4_4_,fVar13);
        fVar13 = cosf(local_a8);
        vert.field_0.x = fVar13 * (float)local_148;
        fVar13 = sinf(local_a8);
        vert.field_2.z = fVar13 * (float)local_148;
        vert.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                       local_48._0_4_;
        tcoord.field_0.x = local_154 / fVar14;
        local_15c = local_d8;
        local_14c = 0.0;
        local_150 = local_128;
        fVar13 = remap(&local_15c,&local_14c,&local_150,&minTexYNormalized,&local_13c,true);
        tcoord.field_1.y = 1.0 - fVar13;
        Mesh::addTexCoord(__return_storage_ptr__,&tcoord);
        Mesh::addVertex(__return_storage_ptr__,&vert);
        Mesh::addNormal(__return_storage_ptr__,&local_e8);
      }
      iVar1 = (int)local_138._0_4_ + 1;
    }
    if (DVar2 == TRIANGLES) {
      uVar10 = (int)local_b8 + 1;
      iVar3 = 0;
      iVar1 = 0;
      if (0 < _radiusSegments) {
        iVar1 = _radiusSegments;
      }
      local_148 = CONCAT44(local_148._4_4_,iVar1);
      while( true ) {
        uVar8 = (ulong)uVar10;
        if ((float)iVar3 == (float)local_c0) break;
        iVar3 = iVar3 + 1;
        iVar1 = (int)(float)local_148;
        local_b8 = uVar8;
        while (bVar12 = iVar1 != 0, iVar1 = iVar1 + -1, bVar12) {
          uVar9 = (uint32_t)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar9 - 1);
          Mesh::addIndex(__return_storage_ptr__,uVar9);
          Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar9);
          if (2 < (int)local_90) {
            Mesh::addIndex(__return_storage_ptr__,uVar9);
            Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar9 + 1);
            Mesh::addIndex(__return_storage_ptr__,_radiusSegments + uVar9);
          }
          uVar8 = (ulong)(uVar9 + 1);
        }
        uVar10 = (int)local_b8 + (int)local_120;
      }
    }
    else {
      iVar3 = _radiusSegments + (int)local_b8 + 1;
      iVar1 = 0;
      uVar8 = local_b8;
      while ((float)iVar1 != (float)local_c0) {
        iVar1 = iVar1 + 1;
        for (iVar5 = 0; iVar5 <= _radiusSegments; iVar5 = iVar5 + 1) {
          Mesh::addIndex(__return_storage_ptr__,iVar5 + (int)uVar8);
          Mesh::addIndex(__return_storage_ptr__,iVar3 + iVar5);
        }
        iVar3 = iVar3 + (int)local_120;
        uVar8 = (ulong)(uint)((int)uVar8 + (int)local_120);
      }
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh cylinderMesh( float _radius, float _height, int _radiusSegments, int _heightSegments, int _numCapSegments, bool _bCapped, DrawMode _drawMode ) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;
        
    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    int capSegs = _numCapSegments;
    capSegs = capSegs+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    if ( capSegs < 2 ) _bCapped = false;
    if (!_bCapped) capSegs=1;

    float angleIncRadius = -1 * (TAU/((float)_radiusSegments-1.f));
    float heightInc = _height/((float)_heightSegments-1.f);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec2 tcoord;
    glm::vec3 normal;
    glm::vec3 up(0,1,0);

    std::size_t vertOffset = 0;

    float maxTexY   = _heightSegments-1.f;
    if (capSegs > 0)
        maxTexY += (capSegs*2)-2.f;
        
    float maxTexYNormalized = (capSegs-1.f) / maxTexY;

    // add the top cap //
    if (_bCapped && capSegs > 0) {
        normal = {0.f, -1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, 0.0, _radius, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = -halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, 0, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    if (y > 0) {
                        // first triangle //
                        mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }

                    // second triangle //
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();

    }

    //maxTexY            = _heightSegments-1.f + capSegs-1.f;
    float minTexYNormalized = 0;
    if (_bCapped) minTexYNormalized = maxTexYNormalized;
    maxTexYNormalized   = 1.f;
    if (_bCapped) maxTexYNormalized = (_heightSegments) / maxTexY;

    // cylinder vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        normal = {1.f, 0.f, 0.f};
        for (int ix = 0; ix < _radiusSegments; ix++) {

            //newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius);
            vert.x = cos(ix*angleIncRadius) * _radius;
            vert.y = heightInc*float(iy) - halfH;
            vert.z = sin(ix*angleIncRadius) * _radius;

            tcoord.x = float(ix)/(float(_radiusSegments)-1.f);
            tcoord.y = 1.f - remap(iy, 0, _heightSegments-1, minTexYNormalized, maxTexYNormalized, true );

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );

            normal = glm::rotate(normal, -angleIncRadius, up);

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                // first triangle //
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset);
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    } else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // add the bottom cap
    if (_bCapped && capSegs > 0) {
        minTexYNormalized = maxTexYNormalized;
        maxTexYNormalized   = 1.f;

        normal = {0.f, 1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, _radius, 0.0, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, minTexYNormalized, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs -1 && capSegs > 2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();
    }
    
    mesh.computeTangents();

    return mesh;
}